

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

int Vec_IntGetEntry(Vec_Int_t *p,int i)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  
  iVar2 = p->nSize;
  if (i < iVar2) goto LAB_003f70d4;
  iVar4 = i + 1;
  iVar1 = p->nCap;
  if (i < iVar1 * 2) {
    if (iVar1 <= i) {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc((long)iVar1 << 3);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,(long)iVar1 << 3);
      }
      p->pArray = piVar3;
      iVar2 = iVar1 * 2;
LAB_003f70a4:
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      p->nCap = iVar2;
      iVar2 = p->nSize;
    }
  }
  else if (iVar1 <= i) {
    if (p->pArray == (int *)0x0) {
      piVar3 = (int *)malloc((long)iVar4 << 2);
    }
    else {
      piVar3 = (int *)realloc(p->pArray,(long)iVar4 << 2);
    }
    p->pArray = piVar3;
    iVar2 = iVar4;
    goto LAB_003f70a4;
  }
  if (iVar2 <= i) {
    memset(p->pArray + iVar2,0,(ulong)(uint)(i - iVar2) * 4 + 4);
  }
  p->nSize = iVar4;
  iVar2 = iVar4;
LAB_003f70d4:
  if ((-1 < i) && (i < iVar2)) {
    return p->pArray[(uint)i];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int Vec_IntGetEntry( Vec_Int_t * p, int i )
{
    Vec_IntFillExtra( p, i + 1, 0 );
    return Vec_IntEntry( p, i );
}